

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::ARITH_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  SQObjectType SVar1;
  SQObjectType SVar2;
  long lVar3;
  long lVar4;
  SQObjectValue SVar5;
  bool bVar6;
  SQObjectType SVar7;
  long x;
  char *s;
  double dVar8;
  SQFloat SVar9;
  SQFloat x_00;
  SQFloat SVar10;
  
  SVar1 = (o1->super_SQObject)._type;
  SVar2 = (o2->super_SQObject)._type;
  SVar7 = SVar2 | SVar1;
  if ((SVar7 == 0x5000006) || (SVar7 == OT_FLOAT)) {
    SVar5 = (o1->super_SQObject)._unVal;
    if (SVar1 == OT_INTEGER) {
      SVar9 = (SQFloat)SVar5.nInteger;
    }
    else {
      SVar9 = SVar5.fFloat;
    }
    SVar5 = (o2->super_SQObject)._unVal;
    if (SVar2 == OT_INTEGER) {
      SVar10 = (SQFloat)SVar5.nInteger;
    }
    else {
      SVar10 = SVar5.fFloat;
    }
    x_00 = 15.0;
    switch(op) {
    case 0x25:
      dVar8 = fmod((double)SVar9,(double)SVar10);
      x_00 = (SQFloat)dVar8;
      break;
    case 0x2a:
      x_00 = SVar9 * SVar10;
      break;
    case 0x2b:
      x_00 = SVar9 + SVar10;
      break;
    case 0x2d:
      x_00 = SVar9 - SVar10;
      break;
    case 0x2f:
      x_00 = SVar9 / SVar10;
    }
    SQObjectPtr::operator=(trg,x_00);
  }
  else if (SVar7 == OT_INTEGER) {
    x = 0xdeadbeef;
    if (op - 0x25 < 0xb) {
      lVar3 = (o1->super_SQObject)._unVal.nInteger;
      lVar4 = (o2->super_SQObject)._unVal.nInteger;
      switch(op) {
      case 0x25:
        if (lVar4 == 0) {
          s = "modulo by zero";
          goto LAB_0011ad67;
        }
        if (lVar3 == -0x80000000 && lVar4 == -1) {
          x = 0;
        }
        else {
          x = lVar3 % lVar4;
        }
        break;
      case 0x2a:
        x = lVar4 * lVar3;
        break;
      case 0x2b:
        x = lVar4 + lVar3;
        break;
      case 0x2d:
        x = lVar3 - lVar4;
        break;
      case 0x2f:
        if (lVar4 == 0) {
          s = "division by zero";
LAB_0011ad67:
          Raise_Error(this,s);
          return false;
        }
        if (lVar3 == -0x80000000 && lVar4 == -1) {
          s = "integer overflow";
          goto LAB_0011ad67;
        }
        x = lVar3 / lVar4;
      }
    }
    SQObjectPtr::operator=(trg,x);
  }
  else {
    if ((SVar7 & 0x10) == 0 || op != 0x2b) {
      bVar6 = ArithMetaMethod(this,op,o1,o2,trg);
    }
    else {
      bVar6 = StringCat(this,o1,o2,trg);
    }
    if (bVar6 == false) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SQVM::ARITH_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger tmask = sq_type(o1)| sq_type(o2);
    switch(tmask) {
        case OT_INTEGER:{
            SQInteger res, i1 = _integer(o1), i2 = _integer(o2);
            switch(op) {
            case '+': res = i1 + i2; break;
            case '-': res = i1 - i2; break;
            case '/': if (i2 == 0) { Raise_Error(_SC("division by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { Raise_Error(_SC("integer overflow")); return false; }
                    res = i1 / i2;
                    break;
            case '*': res = i1 * i2; break;
            case '%': if (i2 == 0) { Raise_Error(_SC("modulo by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { res = 0; break; }
                    res = i1 % i2;
                    break;
            default: res = 0xDEADBEEF;
            }
            trg = res; }
            break;
        case (OT_FLOAT|OT_INTEGER):
        case (OT_FLOAT):{
            SQFloat res, f1 = tofloat(o1), f2 = tofloat(o2);
            switch(op) {
            case '+': res = f1 + f2; break;
            case '-': res = f1 - f2; break;
            case '/': res = f1 / f2; break;
            case '*': res = f1 * f2; break;
            case '%': res = SQFloat(fmod((double)f1,(double)f2)); break;
            default: res = 0x0f;
            }
            trg = res; }
            break;
        default:
            if(op == '+' && (tmask & _RT_STRING)){
                if(!StringCat(o1, o2, trg)) return false;
            }
            else if(!ArithMetaMethod(op,o1,o2,trg)) {
                return false;
            }
    }
    return true;
}